

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
          (TEST_GROUP_CppUTestGroupDoublingFactorCounterTest *this,Tile tile,bool is_open)

{
  initializer_list<mahjong::Tile> __l;
  initializer_list<mahjong::Tile> __l_00;
  allocator<mahjong::Tile> local_a1;
  Tile local_a0;
  Tile local_9c;
  Tile local_98;
  Tile local_94;
  iterator local_90;
  size_type local_88;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_80;
  allocator<mahjong::Tile> local_51;
  Tile local_50;
  Tile local_4c;
  Tile local_48;
  Tile local_44;
  iterator local_40;
  size_type local_38;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_30;
  byte local_15;
  Tile local_14;
  bool is_open_local;
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest *pTStack_10;
  Tile tile_local;
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest *this_local;
  
  local_15 = is_open;
  local_14 = tile;
  pTStack_10 = this;
  mahjong::PlayerHand::add(&this->h,tile);
  mahjong::PlayerHand::add(&this->h,local_14);
  mahjong::PlayerHand::add(&this->h,local_14);
  mahjong::PlayerHand::add(&this->h,local_14);
  if ((local_15 & 1) == 0) {
    local_a0 = local_14;
    local_9c = local_14;
    local_98 = local_14;
    local_94 = local_14;
    local_90 = &local_a0;
    local_88 = 4;
    std::allocator<mahjong::Tile>::allocator(&local_a1);
    __l._M_len = local_88;
    __l._M_array = local_90;
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_80,__l,&local_a1);
    mahjong::PlayerHand::bindClosedQuad(&this->h,&local_80);
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~vector(&local_80);
    std::allocator<mahjong::Tile>::~allocator(&local_a1);
  }
  else {
    local_50 = local_14;
    local_4c = local_14;
    local_48 = local_14;
    local_44 = local_14;
    local_40 = &local_50;
    local_38 = 4;
    std::allocator<mahjong::Tile>::allocator(&local_51);
    __l_00._M_len = local_38;
    __l_00._M_array = local_40;
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_30,__l_00,&local_51);
    mahjong::PlayerHand::bindOpenQuad(&this->h,&local_30);
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~vector(&local_30);
    std::allocator<mahjong::Tile>::~allocator(&local_51);
  }
  return;
}

Assistant:

void addQuad(Tile tile, bool is_open)
	{
		h.add(tile);
		h.add(tile);
		h.add(tile);
		h.add(tile);

		if (is_open)
		{
			h.bindOpenQuad({ tile,tile,tile,tile });
		}
		else
		{
			h.bindClosedQuad({ tile,tile,tile,tile });
		}
	}